

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall
lodepng::ExtractZlib::getTreeInflateDynamic
          (ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD,uchar *in,size_t *bp,
          size_t inlength)

{
  unsigned_long uVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  int iVar6;
  size_t sVar7;
  long in_RDI;
  ulong *in_R8;
  ulong in_R9;
  size_t j_1;
  size_t j;
  size_t n_2;
  size_t n_1;
  size_t n;
  unsigned_long value;
  unsigned_long code;
  size_t replength;
  size_t i;
  size_t i_2;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> codelengthcode;
  size_t HCLEN;
  size_t HDIST;
  size_t HLIT;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlenD;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlen;
  size_t bpstart;
  value_type_conflict4 *in_stack_fffffffffffffdb8;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_stack_fffffffffffffdc0
  ;
  allocator_type *in_stack_fffffffffffffdc8;
  allocator_type *in_stack_fffffffffffffdd0;
  size_t *in_stack_fffffffffffffdd8;
  ExtractZlib *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  uchar *in_stack_fffffffffffffdf0;
  ExtractZlib *in_stack_fffffffffffffdf8;
  unsigned_long local_1b0;
  size_type local_150;
  size_type local_140;
  uchar *local_138;
  uchar *local_128;
  uchar *local_118;
  value_type local_110;
  uchar *in_stack_ffffffffffffff08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *bitlen_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ulong local_e0;
  ulong local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  ulong local_b0;
  long local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  undefined4 local_98;
  undefined8 local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88 [2];
  undefined8 local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ulong local_38;
  ulong local_30;
  ulong *local_28;
  
  local_38 = *in_R8;
  local_58 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x148e8b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
             (size_type)in_stack_fffffffffffffdd8,(value_type_conflict2 *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x148ebc);
  local_90 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x148edd);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
             (size_type)in_stack_fffffffffffffdd8,(value_type_conflict2 *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x148f0e);
  if (*local_28 >> 3 < local_30 - 2) {
    uVar1 = readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                               (uchar *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8)
    ;
    local_a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar1 + 0x101);
    uVar1 = readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                               (uchar *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8)
    ;
    local_a8 = uVar1 + 1;
    uVar1 = readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                               (uchar *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8)
    ;
    local_b0 = uVar1 + 4;
    iVar6 = (int)local_a0 + -0x101;
    pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_fffffffffffffdc0);
    pvVar2->hlit = iVar6;
    iVar6 = (int)local_a8 + -1;
    pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_fffffffffffffdc0);
    pvVar2->hdist = iVar6;
    iVar6 = (int)local_b0 + -4;
    pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_fffffffffffffdc0);
    pvVar2->hclen = iVar6;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1490f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
               (size_type)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x149121);
    for (local_d8 = 0; local_d8 < 0x13; local_d8 = local_d8 + 1) {
      if (local_d8 < local_b0) {
        local_1b0 = readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                                       (uchar *)in_stack_fffffffffffffdd0,
                                       (size_t)in_stack_fffffffffffffdc8);
      }
      else {
        local_1b0 = 0;
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_c8,*(size_type *)(CLCL + local_d8 * 8));
      *pvVar3 = local_1b0;
    }
    for (local_e0 = 0;
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_c8),
        local_e0 < sVar4; local_e0 = local_e0 + 1) {
      std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                (in_stack_fffffffffffffdc0);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_c8,local_e0);
      in_stack_ffffffffffffff1c = (undefined4)*pvVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
    }
    iVar6 = HuffmanTree::makeFromLengths
                      ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff10,(unsigned_long)in_stack_ffffffffffffff08);
    *(int *)(in_RDI + 8) = iVar6;
    if (*(int *)(in_RDI + 8) == 0) {
      bitlen_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      while (bitlen_00 <
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + local_a8)) {
        uVar1 = huffmanDecodeSymbol(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                    (HuffmanTree *)in_stack_fffffffffffffde0,
                                    (size_t)in_stack_fffffffffffffdd8);
        if (*(int *)(in_RDI + 8) != 0) {
          local_98 = 1;
          goto LAB_00149c35;
        }
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_fffffffffffffdc0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8);
        if (uVar1 < 0x10) {
          if (bitlen_00 < local_a0) {
            pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&(bitlen_00->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1);
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_50,(size_type)bitlen_00);
            *pvVar3 = uVar1;
            bitlen_00 = pvVar8;
          }
          else {
            pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&(bitlen_00->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1);
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_88,(long)bitlen_00 - (long)local_a0);
            *pvVar3 = uVar1;
            bitlen_00 = pvVar8;
          }
        }
        else if (uVar1 == 0x10) {
          if (local_30 <= *local_28 >> 3) {
            *(undefined4 *)(in_RDI + 8) = 0x32;
            local_98 = 1;
            goto LAB_00149c35;
          }
          uVar1 = readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                                     (uchar *)in_stack_fffffffffffffdd0,
                                     (size_t)in_stack_fffffffffffffdc8);
          in_stack_ffffffffffffff08 = (uchar *)(uVar1 + 3);
          if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)&bitlen_00[-1].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7U) < local_a0) {
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_50,
                                (size_type)
                                ((long)&bitlen_00[-1].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            local_110 = *pvVar3;
          }
          else {
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_88,(long)bitlen_00 + (-1 - (long)local_a0));
            local_110 = *pvVar3;
          }
          for (local_118 = (uchar *)0x0; local_118 < in_stack_ffffffffffffff08;
              local_118 = local_118 + 1) {
            if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start + local_a8) <= bitlen_00) {
              *(undefined4 *)(in_RDI + 8) = 0xd;
              local_98 = 1;
              goto LAB_00149c35;
            }
            if (bitlen_00 < local_a0) {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_50,(size_type)bitlen_00);
              *pvVar3 = local_110;
            }
            else {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_88,(long)bitlen_00 - (long)local_a0);
              *pvVar3 = local_110;
            }
            bitlen_00 = pvVar8;
          }
        }
        else if (uVar1 == 0x11) {
          if (local_30 <= *local_28 >> 3) {
            *(undefined4 *)(in_RDI + 8) = 0x32;
            local_98 = 1;
            goto LAB_00149c35;
          }
          in_stack_fffffffffffffdf8 =
               (ExtractZlib *)
               readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                                  (uchar *)in_stack_fffffffffffffdd0,
                                  (size_t)in_stack_fffffffffffffdc8);
          in_stack_ffffffffffffff08 = (uchar *)((long)&in_stack_fffffffffffffdf8->zlibinfo + 3);
          std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                    (in_stack_fffffffffffffdc0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
          for (local_128 = (uchar *)0x0; local_128 < in_stack_ffffffffffffff08;
              local_128 = local_128 + 1) {
            if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start + local_a8) <= bitlen_00) {
              *(undefined4 *)(in_RDI + 8) = 0xe;
              local_98 = 1;
              goto LAB_00149c35;
            }
            if (bitlen_00 < local_a0) {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_50,(size_type)bitlen_00);
              *pvVar3 = 0;
            }
            else {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_88,(long)bitlen_00 - (long)local_a0);
              *pvVar3 = 0;
            }
            bitlen_00 = pvVar8;
          }
        }
        else {
          if (uVar1 != 0x12) {
            *(undefined4 *)(in_RDI + 8) = 0x10;
            local_98 = 1;
            goto LAB_00149c35;
          }
          if (local_30 <= *local_28 >> 3) {
            *(undefined4 *)(in_RDI + 8) = 0x32;
            local_98 = 1;
            goto LAB_00149c35;
          }
          in_stack_fffffffffffffdf0 =
               (uchar *)readBitsFromStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                                           (uchar *)in_stack_fffffffffffffdd0,
                                           (size_t)in_stack_fffffffffffffdc8);
          in_stack_ffffffffffffff08 = in_stack_fffffffffffffdf0 + 0xb;
          std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                    (in_stack_fffffffffffffdc0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
          for (local_138 = (uchar *)0x0; local_138 < in_stack_ffffffffffffff08;
              local_138 = local_138 + 1) {
            if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start + local_a8) <= bitlen_00) {
              *(undefined4 *)(in_RDI + 8) = 0xf;
              local_98 = 1;
              goto LAB_00149c35;
            }
            if (bitlen_00 < local_a0) {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_50,(size_type)bitlen_00);
              *pvVar3 = 0;
            }
            else {
              pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(bitlen_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
              pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_88,(long)bitlen_00 - (long)local_a0);
              *pvVar3 = 0;
            }
            bitlen_00 = pvVar8;
          }
        }
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,0x100);
      if (*pvVar3 == 0) {
        *(undefined4 *)(in_RDI + 8) = 0x40;
        local_98 = 1;
      }
      else {
        iVar6 = HuffmanTree::makeFromLengths
                          ((HuffmanTree *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),bitlen_00,
                           (unsigned_long)in_stack_ffffffffffffff08);
        *(int *)(in_RDI + 8) = iVar6;
        if (*(int *)(in_RDI + 8) == 0) {
          iVar6 = HuffmanTree::makeFromLengths
                            ((HuffmanTree *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),bitlen_00
                             ,(unsigned_long)in_stack_ffffffffffffff08);
          *(int *)(in_RDI + 8) = iVar6;
          if (*(int *)(in_RDI + 8) == 0) {
            sVar7 = *local_28 - local_38;
            pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::
                     back(in_stack_fffffffffffffdc0);
            pvVar2->treebits = sVar7;
            local_140 = 0;
            while (sVar4 = local_140,
                  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    (&local_50), sVar4 < sVar5) {
              pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>
                       ::back(in_stack_fffffffffffffdc0);
              in_stack_fffffffffffffdd0 = (allocator_type *)&pvVar2->litlenlengths;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_50,local_140);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdb8);
              local_140 = local_140 + 1;
            }
            local_150 = 0;
            while (sVar4 = local_150,
                  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_88)
                  , sVar4 < sVar5) {
              pvVar2 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>
                       ::back(in_stack_fffffffffffffdc0);
              in_stack_fffffffffffffdc0 =
                   (vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *)
                   &pvVar2->distlengths;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (local_88,local_150);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdb8);
              local_150 = local_150 + 1;
            }
            local_98 = 0;
          }
          else {
            local_98 = 1;
          }
        }
        else {
          local_98 = 1;
        }
      }
    }
    else {
      local_98 = 1;
    }
LAB_00149c35:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  }
  else {
    *(undefined4 *)(in_RDI + 8) = 0x31;
    local_98 = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void getTreeInflateDynamic(HuffmanTree& tree, HuffmanTree& treeD,
                             const unsigned char* in, size_t& bp, size_t inlength) {
    size_t bpstart = bp;
    //get the tree of a deflated block with dynamic tree, the tree itself is also Huffman compressed with a known tree
    std::vector<unsigned long> bitlen(288, 0), bitlenD(32, 0);
    if(bp >> 3 >= inlength - 2) { error = 49; return; } //the bit pointer is or will go past the memory
    size_t HLIT =  readBitsFromStream(bp, in, 5) + 257; //number of literal/length codes + 257
    size_t HDIST = readBitsFromStream(bp, in, 5) + 1; //number of dist codes + 1
    size_t HCLEN = readBitsFromStream(bp, in, 4) + 4; //number of code length codes + 4
    zlibinfo->back().hlit = HLIT - 257;
    zlibinfo->back().hdist = HDIST - 1;
    zlibinfo->back().hclen = HCLEN - 4;
    std::vector<unsigned long> codelengthcode(19); //lengths of tree to decode the lengths of the dynamic tree
    for(size_t i = 0; i < 19; i++) codelengthcode[CLCL[i]] = (i < HCLEN) ? readBitsFromStream(bp, in, 3) : 0;
    //code length code lengths
    for(size_t i = 0; i < codelengthcode.size(); i++) zlibinfo->back().clcl.push_back(codelengthcode[i]);
    error = codelengthcodetree.makeFromLengths(codelengthcode, 7); if(error) return;
    size_t i = 0, replength;
    while(i < HLIT + HDIST) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codelengthcodetree, inlength); if(error) return;
      zlibinfo->back().treecodes.push_back(code); //tree symbol code
      if(code <= 15)  { if(i < HLIT) bitlen[i++] = code; else bitlenD[i++ - HLIT] = code; } //a length code
      else if(code == 16) { //repeat previous
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 2);
        unsigned long value; //set value to the previous code
        if((i - 1) < HLIT) value = bitlen[i - 1];
        else value = bitlenD[i - HLIT - 1];
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 13; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = value; else bitlenD[i++ - HLIT] = value;
        }
      } else if(code == 17) { //repeat "0" 3-10 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 3);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 14; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      } else if(code == 18) { //repeat "0" 11-138 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 11 + readBitsFromStream(bp, in, 7);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 15; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      }
      else { error = 16; return; } //error: somehow an unexisting code appeared. This can never happen.
    }
    if(bitlen[256] == 0) { error = 64; return; } //the length of the end code 256 must be larger than 0
    error = tree.makeFromLengths(bitlen, 15);
    if(error) return; //now we've finally got HLIT and HDIST, so generate the code trees, and the function is done
    error = treeD.makeFromLengths(bitlenD, 15);
    if(error) return;
    zlibinfo->back().treebits = bp - bpstart;
    //lit/len/end symbol lengths
    for(size_t j = 0; j < bitlen.size(); j++) zlibinfo->back().litlenlengths.push_back(bitlen[j]);
    //dist lengths
    for(size_t j = 0; j < bitlenD.size(); j++) zlibinfo->back().distlengths.push_back(bitlenD[j]);
  }